

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_subgroup_op(CompilerMSL *this,Instruction *i)

{
  ushort uVar1;
  Platform PVar2;
  uint uVar3;
  uint32_t uVar4;
  BaseType input_type;
  BaseType BVar5;
  uint32_t *puVar6;
  CompilerError *this_00;
  uint uVar7;
  uint32_t uVar8;
  char *pcVar9;
  uint32_t local_5c;
  uint32_t local_58;
  allocator local_51;
  string local_50;
  
  puVar6 = Compiler::stream((Compiler *)this,i);
  uVar1 = i->op;
  if ((this->msl_options).emulate_subgroups == true) {
    if (uVar1 == 0x14d) {
      uVar4 = *puVar6;
      uVar8 = puVar6[1];
      ::std::__cxx11::string::string((string *)&local_50,"true",&local_51);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar4,uVar8,&local_50,true,false);
      ::std::__cxx11::string::~string((string *)&local_50);
      return;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Subgroup emulation does not support operations other than Elect.");
    goto LAB_001ca0b4;
  }
  if ((this->msl_options).msl_version < 20000) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Subgroups are only supported in Metal 2.0 and up.");
    goto LAB_001ca0b4;
  }
  uVar4 = CompilerGLSL::get_integer_width_for_instruction(&this->super_CompilerGLSL,i);
  input_type = to_signed_basetype(uVar4);
  BVar5 = to_unsigned_basetype(uVar4);
  PVar2 = (this->msl_options).platform;
  if (PVar2 == macOS) {
    if (((this->msl_options).msl_version < 0x4e84) &&
       (((0xb < uVar1 - 0x151 || ((0xf01U >> (uVar1 - 0x151 & 0x1f) & 1) == 0)) && (uVar1 != 0x1150)
        ))) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.");
      goto LAB_001ca0b4;
    }
    goto switchD_001c9622_caseD_151;
  }
  if ((PVar2 != iOS) ||
     ((uVar3 = (this->msl_options).msl_version, 0x4f4b < uVar3 &&
      ((this->msl_options).ios_use_simdgroup_functions != false)))) goto switchD_001c9622_caseD_151;
  switch(uVar1) {
  case 0x14d:
    if (uVar3 < 0x4ee8) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Elect on iOS requires Metal 2.2 and up.");
      goto LAB_001ca0b4;
    }
    goto LAB_001c9fa2;
  case 0x14e:
  case 0x14f:
  case 0x150:
  case 0x153:
  case 0x154:
  case 0x155:
  case 0x156:
  case 0x157:
  case 0x158:
switchD_001c9622_caseD_14e:
    if (uVar3 < 0x4ee8) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Ballot ops on iOS requires Metal 2.2 and up.");
      goto LAB_001ca0b4;
    }
    break;
  case 0x151:
  case 0x159:
  case 0x15a:
  case 0x15b:
  case 0x15c:
  case 0x16d:
  case 0x16e:
    break;
  case 0x152:
    if (uVar3 < 0x4ee8) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"BroadcastFirst on iOS requires Metal 2.2 and up.");
      goto LAB_001ca0b4;
    }
LAB_001c9fa2:
    local_5c = *puVar6;
    local_58 = puVar6[1];
    goto LAB_001c9fad;
  case 0x15d:
  case 0x15e:
  case 0x15f:
  case 0x160:
  case 0x161:
  case 0x162:
  case 0x163:
  case 0x164:
  case 0x165:
  case 0x166:
  case 0x167:
  case 0x168:
  case 0x169:
  case 0x16a:
  case 0x16b:
  case 0x16c:
switchD_001c9622_caseD_15d:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,
               "Subgroup ops beyond broadcast, ballot, and shuffle on iOS require Metal 2.3 and up."
              );
    goto LAB_001ca0b4;
  default:
    if ((uVar1 - 0x114c < 3) || (uVar1 == 0x1145)) goto switchD_001c9622_caseD_14e;
    if (uVar1 != 0x1150) goto switchD_001c9622_caseD_15d;
  }
switchD_001c9622_caseD_151:
  local_5c = *puVar6;
  local_58 = puVar6[1];
  if ((uVar1 - 0x1145 < 0xc) && ((0xb83U >> (uVar1 - 0x1145 & 0x1f) & 1) != 0)) {
    uVar3 = 2;
  }
  else {
LAB_001c9fad:
    uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[2]);
    if (uVar4 != 3) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Only subgroup scope is supported.");
      goto LAB_001ca0b4;
    }
    uVar3 = 3;
  }
  switch(uVar1) {
  case 0x14d:
    if (((this->msl_options).platform == iOS) &&
       (((this->msl_options).ios_use_simdgroup_functions & 1U) == 0)) {
      ::std::__cxx11::string::string((string *)&local_50,"quad_is_first()",&local_51);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,local_5c,local_58,&local_50,false,false);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_50,"simd_is_first()",&local_51);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,local_5c,local_58,&local_50,false,false);
    }
    ::std::__cxx11::string::~string((string *)&local_50);
    goto LAB_001ca065;
  case 0x14e:
    goto switchD_001c9732_caseD_14e;
  case 0x14f:
switchD_001c9732_caseD_14f:
    uVar4 = puVar6[uVar3];
    if (((this->msl_options).platform == iOS) &&
       (((this->msl_options).ios_use_simdgroup_functions & 1U) == 0)) {
      pcVar9 = "quad_any";
    }
    else {
      pcVar9 = "simd_any";
    }
    goto LAB_001ca053;
  case 0x150:
switchD_001c9732_caseD_150:
    uVar4 = puVar6[uVar3];
    pcVar9 = "spvSubgroupAllEqual";
    goto LAB_001ca053;
  case 0x151:
switchD_001c9732_caseD_151:
    uVar4 = puVar6[uVar3];
    uVar8 = puVar6[(ulong)uVar3 + 1];
    pcVar9 = "spvSubgroupBroadcast";
    break;
  case 0x152:
switchD_001c9732_caseD_152:
    uVar4 = puVar6[uVar3];
    pcVar9 = "spvSubgroupBroadcastFirst";
    goto LAB_001ca053;
  case 0x153:
switchD_001c9732_caseD_153:
    uVar4 = puVar6[uVar3];
    pcVar9 = "spvSubgroupBallot";
    goto LAB_001ca053;
  case 0x154:
    uVar4 = puVar6[uVar3];
    uVar8 = this->builtin_subgroup_invocation_id_id;
    goto LAB_001c9bbd;
  case 0x155:
    uVar4 = puVar6[uVar3];
    uVar8 = puVar6[(ulong)uVar3 + 1];
LAB_001c9bbd:
    pcVar9 = "spvSubgroupBallotBitExtract";
    break;
  case 0x156:
    uVar7 = uVar3 + 1;
    uVar4 = puVar6[uVar3];
    if (uVar4 == 2) {
      uVar4 = puVar6[uVar7];
      uVar8 = this->builtin_subgroup_invocation_id_id;
      pcVar9 = "spvSubgroupBallotExclusiveBitCount";
    }
    else if (uVar4 == 1) {
      uVar4 = puVar6[uVar7];
      uVar8 = this->builtin_subgroup_invocation_id_id;
      pcVar9 = "spvSubgroupBallotInclusiveBitCount";
    }
    else {
      if (uVar4 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid BitCount operation.");
        goto LAB_001ca0b4;
      }
      uVar4 = puVar6[uVar7];
      uVar8 = this->builtin_subgroup_size_id;
      pcVar9 = "spvSubgroupBallotBitCount";
    }
    break;
  case 0x157:
    uVar4 = puVar6[uVar3];
    uVar8 = this->builtin_subgroup_size_id;
    pcVar9 = "spvSubgroupBallotFindLSB";
    break;
  case 0x158:
    uVar4 = puVar6[uVar3];
    uVar8 = this->builtin_subgroup_size_id;
    pcVar9 = "spvSubgroupBallotFindMSB";
    break;
  case 0x159:
    uVar4 = puVar6[uVar3];
    uVar8 = puVar6[(ulong)uVar3 + 1];
    pcVar9 = "spvSubgroupShuffle";
    break;
  case 0x15a:
    uVar4 = puVar6[uVar3];
    uVar8 = puVar6[(ulong)uVar3 + 1];
    pcVar9 = "spvSubgroupShuffleXor";
    break;
  case 0x15b:
    uVar4 = puVar6[uVar3];
    uVar8 = puVar6[(ulong)uVar3 + 1];
    pcVar9 = "spvSubgroupShuffleUp";
    break;
  case 0x15c:
    uVar4 = puVar6[uVar3];
    uVar8 = puVar6[(ulong)uVar3 + 1];
    pcVar9 = "spvSubgroupShuffleDown";
    break;
  case 0x15d:
    switch(puVar6[uVar3]) {
    case 0:
switchD_001c9aa7_caseD_0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_sum";
      break;
    case 1:
switchD_001c9aa7_caseD_1:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_prefix_inclusive_sum";
      break;
    case 2:
switchD_001c9aa7_caseD_2:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_prefix_exclusive_sum";
      break;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_001ca0b4;
      }
LAB_001ca021:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_sum";
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_001ca0b4;
    }
    goto LAB_001ca053;
  case 0x15e:
    switch(puVar6[uVar3]) {
    case 0:
      goto switchD_001c9aa7_caseD_0;
    case 1:
      goto switchD_001c9aa7_caseD_1;
    case 2:
      goto switchD_001c9aa7_caseD_2;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_001ca0b4;
      }
      goto LAB_001ca021;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_001ca0b4;
    }
  case 0x15f:
    switch(puVar6[uVar3]) {
    case 0:
switchD_001c9c68_caseD_0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_product";
      break;
    case 1:
switchD_001c9c68_caseD_1:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_prefix_inclusive_product";
      break;
    case 2:
switchD_001c9c68_caseD_2:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_prefix_exclusive_product";
      break;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_001ca0b4;
      }
LAB_001ca046:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_product";
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_001ca0b4;
    }
    goto LAB_001ca053;
  case 0x160:
    switch(puVar6[uVar3]) {
    case 0:
      goto switchD_001c9c68_caseD_0;
    case 1:
      goto switchD_001c9c68_caseD_1;
    case 2:
      goto switchD_001c9c68_caseD_2;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_001ca0b4;
      }
      goto LAB_001ca046;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_001ca0b4;
    }
  case 0x161:
    if (3 < puVar6[uVar3]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_001ca0b4;
    }
    switch(puVar6[uVar3]) {
    case 0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_min";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMin.");
      goto LAB_001ca0b4;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMin.");
LAB_001ca0b4:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_001ca0b4;
      }
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_min";
    }
LAB_001c9f3d:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,local_5c,local_58,uVar4,pcVar9,input_type,input_type);
    goto LAB_001ca065;
  case 0x162:
    if (3 < puVar6[uVar3]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_001ca0b4;
    }
    switch(puVar6[uVar3]) {
    case 0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_min";
      input_type = BVar5;
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMin.");
      goto LAB_001ca0b4;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMin.");
      goto LAB_001ca0b4;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_001ca0b4;
      }
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_min";
      input_type = BVar5;
    }
    goto LAB_001c9f3d;
  case 0x163:
    if (3 < puVar6[uVar3]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_001ca0b4;
    }
    switch(puVar6[uVar3]) {
    case 0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_min";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMin.");
      goto LAB_001ca0b4;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMin.");
      goto LAB_001ca0b4;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_001ca0b4;
      }
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_min";
    }
    goto LAB_001ca053;
  case 0x164:
    if (3 < puVar6[uVar3]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_001ca0b4;
    }
    switch(puVar6[uVar3]) {
    case 0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_max";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMax.");
      goto LAB_001ca0b4;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMax.");
      goto LAB_001ca0b4;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_001ca0b4;
      }
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_max";
    }
    goto LAB_001c9f3d;
  case 0x165:
    if (3 < puVar6[uVar3]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_001ca0b4;
    }
    switch(puVar6[uVar3]) {
    case 0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_max";
      input_type = BVar5;
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMax.");
      goto LAB_001ca0b4;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMax.");
      goto LAB_001ca0b4;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_001ca0b4;
      }
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_max";
      input_type = BVar5;
    }
    goto LAB_001c9f3d;
  case 0x166:
    if (3 < puVar6[uVar3]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_001ca0b4;
    }
    switch(puVar6[uVar3]) {
    case 0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_max";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMax.");
      goto LAB_001ca0b4;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMax.");
      goto LAB_001ca0b4;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_001ca0b4;
      }
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_max";
    }
    goto LAB_001ca053;
  case 0x167:
    switch(puVar6[uVar3]) {
    case 0:
switchD_001c9d08_caseD_0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_and";
      goto LAB_001ca053;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseAnd.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseAnd.");
      break;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
LAB_001c9f85:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_and";
      goto LAB_001ca053;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_001ca0b4;
  case 0x168:
    switch(puVar6[uVar3]) {
    case 0:
switchD_001c9be9_caseD_0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_or";
      goto LAB_001ca053;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseOr.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseOr.");
      break;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
LAB_001c9ecc:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_or";
      goto LAB_001ca053;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_001ca0b4;
  case 0x169:
    switch(puVar6[uVar3]) {
    case 0:
switchD_001c9a50_caseD_0:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "simd_xor";
      goto LAB_001ca053;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseXor.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseXor.");
      break;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
LAB_001c9f5d:
      uVar4 = puVar6[uVar3 + 1];
      pcVar9 = "quad_xor";
      goto LAB_001ca053;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_001ca0b4;
  case 0x16a:
    switch(puVar6[uVar3]) {
    case 0:
      goto switchD_001c9d08_caseD_0;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalAnd.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalAnd.");
      break;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
      goto LAB_001c9f85;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_001ca0b4;
  case 0x16b:
    switch(puVar6[uVar3]) {
    case 0:
      goto switchD_001c9be9_caseD_0;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalOr.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalOr.");
      break;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
      goto LAB_001c9ecc;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_001ca0b4;
  case 0x16c:
    switch(puVar6[uVar3]) {
    case 0:
      goto switchD_001c9a50_caseD_0;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalXor.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalXor.");
      break;
    case 3:
      uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[(ulong)uVar3 + 2]);
      if (uVar4 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
      goto LAB_001c9f5d;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_001ca0b4;
  case 0x16d:
    uVar4 = puVar6[uVar3];
    uVar8 = puVar6[(ulong)uVar3 + 1];
    pcVar9 = "spvQuadBroadcast";
    break;
  case 0x16e:
    uVar4 = puVar6[uVar3];
    uVar8 = puVar6[(ulong)uVar3 + 1];
    pcVar9 = "spvQuadSwap";
    break;
  default:
    switch(uVar1) {
    case 0x1145:
      goto switchD_001c9732_caseD_153;
    case 0x1146:
      goto switchD_001c9732_caseD_152;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid opcode for subgroup.");
      goto LAB_001ca0b4;
    case 0x114c:
      goto switchD_001c9732_caseD_14e;
    case 0x114d:
      goto switchD_001c9732_caseD_14f;
    case 0x114e:
      goto switchD_001c9732_caseD_150;
    case 0x1150:
      goto switchD_001c9732_caseD_151;
    }
  }
  CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,local_5c,local_58,uVar4,uVar8,pcVar9);
LAB_001ca065:
  CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,local_58);
  return;
switchD_001c9732_caseD_14e:
  uVar4 = puVar6[uVar3];
  if (((this->msl_options).platform == iOS) &&
     (((this->msl_options).ios_use_simdgroup_functions & 1U) == 0)) {
    pcVar9 = "quad_all";
  }
  else {
    pcVar9 = "simd_all";
  }
LAB_001ca053:
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,local_5c,local_58,uVar4,pcVar9);
  goto LAB_001ca065;
}

Assistant:

void CompilerMSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	if (msl_options.emulate_subgroups)
	{
		// In this mode, only the GroupNonUniform cap is supported. The only op
		// we need to handle, then, is OpGroupNonUniformElect.
		if (op != OpGroupNonUniformElect)
			SPIRV_CROSS_THROW("Subgroup emulation does not support operations other than Elect.");
		// In this mode, the subgroup size is assumed to be one, so every invocation
		// is elected.
		emit_op(ops[0], ops[1], "true", true);
		return;
	}

	// Metal 2.0 is required. iOS only supports quad ops on 11.0 (2.0), with
	// full support in 13.0 (2.2). macOS only supports broadcast and shuffle on
	// 10.13 (2.0), with full support in 10.14 (2.1).
	// Note that Apple GPUs before A13 make no distinction between a quad-group
	// and a SIMD-group; all SIMD-groups are quad-groups on those.
	if (!msl_options.supports_msl_version(2))
		SPIRV_CROSS_THROW("Subgroups are only supported in Metal 2.0 and up.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	if (msl_options.is_ios() && (!msl_options.supports_msl_version(2, 3) || !msl_options.ios_use_simdgroup_functions))
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("Subgroup ops beyond broadcast, ballot, and shuffle on iOS require Metal 2.3 and up.");
		case OpGroupNonUniformBroadcastFirst:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("BroadcastFirst on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformElect:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("Elect on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformAny:
		case OpGroupNonUniformAll:
		case OpGroupNonUniformAllEqual:
		case OpGroupNonUniformBallot:
		case OpGroupNonUniformInverseBallot:
		case OpGroupNonUniformBallotBitExtract:
		case OpGroupNonUniformBallotFindLSB:
		case OpGroupNonUniformBallotFindMSB:
		case OpGroupNonUniformBallotBitCount:
		case OpSubgroupBallotKHR:
		case OpSubgroupAllKHR:
		case OpSubgroupAnyKHR:
		case OpSubgroupAllEqualKHR:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("Ballot ops on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpGroupNonUniformQuadSwap:
		case OpGroupNonUniformQuadBroadcast:
		case OpSubgroupReadInvocationKHR:
			break;
		}
	}

	if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 1))
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.");
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpSubgroupReadInvocationKHR:
			break;
		}
	}

	uint32_t op_idx = 0;
	uint32_t result_type = ops[op_idx++];
	uint32_t id = ops[op_idx++];

	Scope scope;
	switch (op)
	{
	case OpSubgroupBallotKHR:
	case OpSubgroupFirstInvocationKHR:
	case OpSubgroupReadInvocationKHR:
	case OpSubgroupAllKHR:
	case OpSubgroupAnyKHR:
	case OpSubgroupAllEqualKHR:
		// These earlier instructions don't have the scope operand.
		scope = ScopeSubgroup;
		break;
	default:
		scope = static_cast<Scope>(evaluate_constant_u32(ops[op_idx++]));
		break;
	}
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		if (msl_options.use_quadgroup_operation())
			emit_op(result_type, id, "quad_is_first()", false);
		else
			emit_op(result_type, id, "simd_is_first()", false);
		break;

	case OpGroupNonUniformBroadcast:
	case OpSubgroupReadInvocationKHR:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupBroadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
	case OpSubgroupFirstInvocationKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupBroadcastFirst");
		break;

	case OpGroupNonUniformBallot:
	case OpSubgroupBallotKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id, "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[op_idx++]);
		switch (operation)
		{
		case GroupOperationReduce:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotBitCount");
			break;
		case GroupOperationInclusiveScan:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotInclusiveBitCount");
			break;
		case GroupOperationExclusiveScan:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotExclusiveBitCount");
			break;
		default:
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		}
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleXor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleUp");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleDown");
		break;

	case OpGroupNonUniformAll:
	case OpSubgroupAllKHR:
		if (msl_options.use_quadgroup_operation())
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_all");
		else
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_all");
		break;

	case OpGroupNonUniformAny:
	case OpSubgroupAnyKHR:
		if (msl_options.use_quadgroup_operation())
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_any");
		else
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_any");
		break;

	case OpGroupNonUniformAllEqual:
	case OpSubgroupAllEqualKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupAllEqual");
		break;

		// clang-format off
#define MSL_GROUP_OP(op, msl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[op_idx++]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_" #msl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_prefix_inclusive_" #msl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_prefix_exclusive_" #msl_op); \
		else if (operation == GroupOperationClusteredReduce) \
		{ \
			/* Only cluster sizes of 4 are supported. */ \
			uint32_t cluster_size = evaluate_constant_u32(ops[op_idx + 1]); \
			if (cluster_size != 4) \
				SPIRV_CROSS_THROW("Metal only supports quad ClusteredReduce."); \
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_" #msl_op); \
		} \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}